

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

string * __thiscall
cmTarget::GetMacContentDirectory
          (string *__return_storage_ptr__,cmTarget *this,string *config,bool implib)

{
  bool bVar1;
  string sStack_38;
  
  GetDirectory(__return_storage_ptr__,this,config,implib);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  bVar1 = IsFrameworkOnApple(this);
  BuildMacContentDirectory(&sStack_38,this,__return_storage_ptr__,config,!bVar1);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetMacContentDirectory(const std::string& config,
                                             bool implib) const
{
  // Start with the output directory for the target.
  std::string fpath = this->GetDirectory(config, implib);
  fpath += "/";
  bool contentOnly = true;
  if(this->IsFrameworkOnApple())
    {
    // additional files with a framework go into the version specific
    // directory
    contentOnly = false;
    }
  fpath = this->BuildMacContentDirectory(fpath, config, contentOnly);
  return fpath;
}